

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<MakefileGenerator::Compiler>::relocate
          (QArrayDataPointer<MakefileGenerator::Compiler> *this,qsizetype offset,Compiler **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<MakefileGenerator::Compiler> *in_RDI;
  Compiler **unaff_retaddr;
  Compiler *res;
  Compiler *first;
  QArrayDataPointer<MakefileGenerator::Compiler> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<MakefileGenerator::Compiler,long_long>
            (first,(longlong)in_RDI,(Compiler *)0x1b4b67);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<MakefileGenerator::Compiler>,MakefileGenerator::Compiler_const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x20 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }